

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLIntraMidSeqDecodeAll
          (DatarateTestSVC *this)

{
  bool bVar1;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var2;
  char *message;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_sl2;
  int bitrate_sl1;
  int bitrate_sl0;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe44;
  double *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int iVar5;
  Message *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  Type TVar6;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffeb8;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_128 [2];
  double local_108;
  AssertionResult local_100;
  int local_ec;
  uint local_d4;
  HasNewFatalFailureHelper local_d0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8 [7];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x38;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",&local_89);
  uVar4 = 300;
  uVar3 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (uint)((ulong)in_stack_fffffffffffffe60 >> 0x20),(uint)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe80,(int)in_RDI);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 500;
  local_a8[1] = 1000;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7ccec9);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate = local_a8[*p_Var2];
  (*(in_RDI->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])();
  in_RDI->intra_only_ = 1;
  in_RDI->frame_sync_ = 0x14;
  in_RDI->frame_to_start_decoding_ = 0;
  in_RDI->layer_to_decode_ = 3;
  in_RDI->number_temporal_layers_ = 3;
  in_RDI->number_spatial_layers_ = 3;
  local_ac = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 3;
  in_RDI->target_layer_bitrate_[0] = (int)(local_ac * 0x32) / 100;
  in_RDI->target_layer_bitrate_[1] = (int)(local_ac * 0x46) / 100;
  in_RDI->target_layer_bitrate_[2] = local_ac;
  local_b0 = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 3 >> 3;
  in_RDI->target_layer_bitrate_[3] = (int)(local_b0 * 0x32) / 100;
  in_RDI->target_layer_bitrate_[4] = (int)(local_b0 * 0x46) / 100;
  in_RDI->target_layer_bitrate_[5] = local_b0;
  local_b4 = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 1 & 0x1fffffff
  ;
  in_RDI->target_layer_bitrate_[6] = (int)(local_b4 * 0x32) / 100;
  in_RDI->target_layer_bitrate_[7] = (int)(local_b4 * 0x46) / 100;
  in_RDI->target_layer_bitrate_[8] = local_b4;
  bVar1 = testing::internal::AlwaysTrue();
  TVar6 = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe70)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_d0);
    if (bVar1) {
      local_d4 = 2;
    }
    else {
      local_d4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
    TVar6 = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if (local_d4 == 0) {
      for (local_ec = 0; TVar6 = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
          local_ec < in_RDI->number_temporal_layers_ * in_RDI->number_spatial_layers_;
          local_ec = local_ec + 1) {
        local_108 = (double)in_RDI->target_layer_bitrate_[local_ec] * 0.585;
        testing::internal::CmpHelperGE<double,double>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (double *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe70 =
               (HasNewFatalFailureHelper *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe44,uVar4),
                          (char (*) [61])CONCAT44(in_stack_fffffffffffffe3c,uVar3));
          in_stack_fffffffffffffe68 =
               (string *)testing::AssertionResult::failure_message((AssertionResult *)0x7cd354);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe70,
                     (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (char *)in_stack_fffffffffffffe60,
                     (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
          testing::Message::~Message((Message *)0x7cd3ae);
        }
        local_d4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7cd435);
        if (local_d4 != 0) goto LAB_007cd738;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (double *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe60 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe44,uVar4),
                          (char (*) [63])CONCAT44(in_stack_fffffffffffffe3c,uVar3));
          in_stack_fffffffffffffe58 =
               testing::AssertionResult::failure_message((AssertionResult *)0x7cd4ff);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe70,
                     (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (char *)in_stack_fffffffffffffe60,
                     (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
          testing::Message::~Message((Message *)0x7cd559);
        }
        local_d4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7cd5dd);
        if (local_d4 != 0) goto LAB_007cd738;
      }
      GetMismatchFrames(in_RDI);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 (int *)in_stack_fffffffffffffe48,(int *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
      iVar5 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffeb0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe70);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x7cd67d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe70,TVar6,(char *)in_stack_fffffffffffffe60
                   ,iVar5,message);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
        testing::Message::~Message((Message *)0x7cd6cb);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7cd72d);
      local_d4 = 0;
      goto LAB_007cd738;
    }
    if (local_d4 != 2) goto LAB_007cd738;
  }
  iVar5 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe70);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe70,TVar6,(char *)in_stack_fffffffffffffe60,iVar5
             ,in_stack_fffffffffffffe50);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8._M_head_impl);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe44,uVar4));
  testing::Message::~Message((Message *)0x7cd228);
  local_d4 = 1;
LAB_007cd738:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7cd745);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLIntraMidSeqDecodeAll() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 500, 1000 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    intra_only_ = 1;
    frame_sync_ = 20;
    frame_to_start_decoding_ = 0;
    layer_to_decode_ = 3;
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.585)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // All 3 spatial layers are decoded, starting at frame 0, so there are
    // and there 300/2 = 150 non-reference frames, so mismatch is 150.
    EXPECT_EQ((int)GetMismatchFrames(), 150);
#endif
  }